

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O2

bool S_CheckSound(sfxinfo_t *startsfx,sfxinfo_t *sfx,TArray<sfxinfo_t_*,_sfxinfo_t_*> *chain)

{
  uint amount;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint i_2;
  ulong uVar4;
  uint i;
  ulong uVar5;
  FRandomSoundList *pFVar6;
  int i_1;
  sfxinfo_t *sfx_local;
  
  bVar1 = true;
  if ((sfx->field_0x30 & 2) == 0) {
    amount = chain->Count;
    sfx_local = sfx;
    uVar3 = TArray<sfxinfo_t_*,_sfxinfo_t_*>::Find(chain,&sfx_local);
    if (chain->Count <= uVar3) {
      TArray<sfxinfo_t_*,_sfxinfo_t_*>::Push(chain,&sfx_local);
      uVar3 = sfx->link;
      if ((sfx->field_0x30 & 1) == 0) {
        if (uVar3 == 0xffffffff) {
          bVar1 = true;
        }
        else if (S_sfx.Array + uVar3 == startsfx) {
          Printf("\x1cGrecursive sound $alias found for %s:\n",(startsfx->name).Chars);
          for (uVar5 = 1; uVar5 < chain->Count; uVar5 = uVar5 + 1) {
            Printf("\x1cI    -> %s\n",(chain->Array[uVar5]->name).Chars);
          }
          TArray<sfxinfo_t_*,_sfxinfo_t_*>::Resize(chain,amount);
          bVar1 = false;
        }
        else {
          bVar1 = S_CheckSound(startsfx,S_sfx.Array + uVar3,chain);
        }
      }
      else {
        pFVar6 = S_rnd.Array + uVar3;
        bVar1 = true;
        for (uVar5 = 0; uVar5 < pFVar6->NumSounds; uVar5 = uVar5 + 1) {
          if (S_sfx.Array + pFVar6->Sounds[uVar5] == startsfx) {
            Printf("\x1cGrecursive sound $random found for %s:\n",(startsfx->name).Chars);
            for (uVar4 = 1; uVar4 < chain->Count; uVar4 = uVar4 + 1) {
              Printf("\x1cI    -> %s\n",(chain->Array[uVar4]->name).Chars);
            }
            bVar1 = false;
          }
          else {
            bVar2 = S_CheckSound(startsfx,S_sfx.Array + pFVar6->Sounds[uVar5],chain);
            bVar1 = bVar1 != false && bVar2;
          }
        }
      }
      if (chain->Count != 0) {
        chain->Count = chain->Count - 1;
      }
    }
  }
  return bVar1;
}

Assistant:

static bool S_CheckSound(sfxinfo_t *startsfx, sfxinfo_t *sfx, TArray<sfxinfo_t *> &chain)
{
	sfxinfo_t *me = sfx;
	bool success = true;
	unsigned siz = chain.Size();

	if (sfx->bPlayerReserve)
	{
		return true;
	}

	// There is a bad link in here, but let's report it only for the sound that contains the broken definition.
	// Once that sound has been disabled this one will work again.
	if (chain.Find(sfx) < chain.Size())
	{
		return true;
	}
	chain.Push(sfx);

	if (me->bRandomHeader)
	{
		const FRandomSoundList *list = &S_rnd[me->link];
		for (int i = 0; i < list->NumSounds; ++i)
		{
			auto rsfx = &S_sfx[list->Sounds[i]];
			if (rsfx == startsfx)
			{
				Printf(TEXTCOLOR_RED "recursive sound $random found for %s:\n", startsfx->name.GetChars());
				success = false;
				for (unsigned i = 1; i<chain.Size(); i++)
				{
					Printf(TEXTCOLOR_ORANGE "    -> %s\n", chain[i]->name.GetChars());
				}
			}
			else
			{
				success &= S_CheckSound(startsfx, rsfx, chain);
			}
		}
	}
	else if (me->link != sfxinfo_t::NO_LINK)
	{
		me = &S_sfx[me->link];
		if (me == startsfx)
		{
			Printf(TEXTCOLOR_RED "recursive sound $alias found for %s:\n", startsfx->name.GetChars());
			success = false;
			for (unsigned i = 1; i<chain.Size(); i++)
			{
				Printf(TEXTCOLOR_ORANGE "    -> %s\n", chain[i]->name.GetChars());
			}
			chain.Resize(siz);
		}
		else
		{
			success &= S_CheckSound(startsfx, me, chain);
		}
	}
	chain.Pop();
	return success;
}